

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

bool UTF_u_to_U<(char)63>(UTF_US16 *us16,UTF_US32 *us32)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  UTF_UC32 uc32;
  UTF_UC16 uc16 [2];
  UTF_US32 *us32_local;
  UTF_US16 *us16_local;
  
  __gnu_cxx::
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::__normal_iterator(&end);
  local_38._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       end(us16);
  end = std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::begin(us16);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) {
      return true;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&end);
    bVar1 = UTF_uc16_is_surrogate_high(*pcVar2);
    if (bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._4_2_ = *pcVar2;
      __gnu_cxx::
      __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
      ::operator++(&end);
      bVar1 = __gnu_cxx::operator==(&end,&local_38);
      if (bVar1) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(us32,L'?');
        return true;
      }
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._6_2_ = *pcVar2;
    }
    else {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
               ::operator*(&end);
      it._M_current._4_2_ = *pcVar2;
      it._M_current._6_2_ = L'\0';
    }
    bVar1 = UTF_uc16_to_uc32((UTF_UC16 *)((long)&it._M_current + 4),(UTF_UC32 *)&it);
    if (!bVar1) {
      it._M_current._0_4_ = L'?';
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(us32,(char32_t)it._M_current);
    __gnu_cxx::
    __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

inline bool
UTF_u_to_U(const UTF_US16& us16, UTF_US32& us32)
{
    UTF_UC16 uc16[2];
    UTF_UC32 uc32;
    UTF_US16::const_iterator it, end = us16.end();
    for (it = us16.begin(); it != end; ++it)
    {
        if (UTF_uc16_is_surrogate_high(*it))
        {
            uc16[0] = *it;
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }

            uc16[1] = *it;
        }
        else
        {
            uc16[0] = *it;
            uc16[1] = 0;
        }

        if (!UTF_uc16_to_uc32(uc16, &uc32))
        {
            if (!t_default_char)
                return false;

            uc32 = UTF_STATIC_CAST(UTF_UC8, t_default_char);
        }

        us32.push_back(uc32);
    }

    return true;
}